

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u32 whereIsCoveringIndex(WhereInfo *pWInfo,Index *pIdx,int iTabCur)

{
  ulong uVar1;
  CoveringIndexCheck ck;
  Walker w;
  Index *local_48;
  int local_40;
  Walker local_38;
  
  if ((pWInfo != (WhereInfo *)0x0) && ((ulong)pIdx->nColumn != 0)) {
    local_38.u.pNC = (NameContext *)&local_48;
    uVar1 = 0;
    do {
      if (0x3e < pIdx->aiColumn[uVar1]) {
        local_38.pParse = (Parse *)0x0;
        local_38.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
        local_38.walkerDepth = 0;
        local_38.eCode = 0;
        local_38._38_2_ = 0;
        local_38.xExprCallback = whereIsCoveringIndexWalkCallback;
        local_38.xSelectCallback = sqlite3SelectWalkNoop;
        local_48 = pIdx;
        local_40 = iTabCur;
        sqlite3WalkSelect(&local_38,(Select *)pWInfo);
        return (uint)local_38.eCode;
      }
      uVar1 = uVar1 + 1;
    } while (pIdx->nColumn != uVar1);
  }
  return 1;
}

Assistant:

static SQLITE_NOINLINE u32 whereIsCoveringIndex(
  WhereInfo *pWInfo,     /* The WHERE clause context */
  Index *pIdx,           /* Index that is being tested */
  int iTabCur            /* Cursor for the table being indexed */
){
  int i;
  struct CoveringIndexCheck ck;
  Walker w;
  if( pWInfo->pSelect==0 ){
    /* We don't have access to the full query, so we cannot check to see
    ** if pIdx is covering.  Assume it is not. */
    return 1;
  }
  for(i=0; i<pIdx->nColumn; i++){
    if( pIdx->aiColumn[i]>=BMS-1 ) break;
  }
  if( i>=pIdx->nColumn ){
    /* pIdx does not index any columns greater than 62, but we know from
    ** colMask that columns greater than 62 are used, so this is not a
    ** covering index */
    return 1;
  }
  ck.pIdx = pIdx;
  ck.iTabCur = iTabCur;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = whereIsCoveringIndexWalkCallback;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  w.u.pCovIdxCk = &ck;
  w.eCode = 0;
  sqlite3WalkSelect(&w, pWInfo->pSelect);
  return w.eCode;
}